

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txmempool.cpp
# Opt level: O0

vector<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
* __thiscall CTxMemPool::GetSortedDepthAndScore(CTxMemPool *this)

{
  long lVar1;
  iterator iVar2;
  iterator iVar3;
  hashed_index<mempoolentry_txid,_SaltedTxidHasher,_std::equal_to<uint256>,_boost::multi_index::detail::nth_layer<1,_CTxMemPoolEntry,_CTxMemPool::CTxMemPoolEntry_Indices,_std::allocator<CTxMemPoolEntry>_>,_boost::mpl::vector0<mpl_::na>,_boost::multi_index::detail::hashed_unique_tag>
  *in_RSI;
  hashed_index<mempoolentry_txid,_SaltedTxidHasher,_std::equal_to<uint256>,_boost::multi_index::detail::nth_layer<1,_CTxMemPoolEntry,_CTxMemPool::CTxMemPoolEntry_Indices,_std::allocator<CTxMemPoolEntry>_>,_boost::mpl::vector0<mpl_::na>,_boost::multi_index::detail::hashed_unique_tag>
  *in_RDI;
  long in_FS_OFFSET;
  vector<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
  *iters;
  iterator mi;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  vector<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
  *in_stack_ffffffffffffff80;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  hashed_index<mempoolentry_txid,_SaltedTxidHasher,_std::equal_to<uint256>,_boost::multi_index::detail::nth_layer<1,_CTxMemPoolEntry,_CTxMemPool::CTxMemPoolEntry_Indices,_std::allocator<CTxMemPoolEntry>_>,_boost::mpl::vector0<mpl_::na>,_boost::multi_index::detail::hashed_unique_tag>
  *this_00;
  size_type in_stack_ffffffffffffffb0;
  vector<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
  *in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  std::
  vector<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
  ::vector((vector<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
            *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  AssertLockHeldInternal<AnnotatedMixin<std::recursive_mutex>>
            ((char *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88),
             (char *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
             (AnnotatedMixin<std::recursive_mutex> *)0x766a48);
  boost::multi_index::detail::
  hashed_index<mempoolentry_txid,_SaltedTxidHasher,_std::equal_to<uint256>,_boost::multi_index::detail::nth_layer<1,_CTxMemPoolEntry,_CTxMemPool::CTxMemPoolEntry_Indices,_std::allocator<CTxMemPoolEntry>_>,_boost::mpl::vector0<mpl_::na>,_boost::multi_index::detail::hashed_unique_tag>
  ::size((hashed_index<mempoolentry_txid,_SaltedTxidHasher,_std::equal_to<uint256>,_boost::multi_index::detail::nth_layer<1,_CTxMemPoolEntry,_CTxMemPool::CTxMemPoolEntry_Indices,_std::allocator<CTxMemPoolEntry>_>,_boost::mpl::vector0<mpl_::na>,_boost::multi_index::detail::hashed_unique_tag>
          *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  std::
  vector<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
  ::reserve(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  boost::multi_index::detail::
  hashed_index<mempoolentry_txid,_SaltedTxidHasher,_std::equal_to<uint256>,_boost::multi_index::detail::nth_layer<1,_CTxMemPoolEntry,_CTxMemPool::CTxMemPoolEntry_Indices,_std::allocator<CTxMemPoolEntry>_>,_boost::mpl::vector0<mpl_::na>,_boost::multi_index::detail::hashed_unique_tag>
  ::begin(in_RSI);
  while( true ) {
    boost::multi_index::detail::
    hashed_index<mempoolentry_txid,_SaltedTxidHasher,_std::equal_to<uint256>,_boost::multi_index::detail::nth_layer<1,_CTxMemPoolEntry,_CTxMemPool::CTxMemPoolEntry_Indices,_std::allocator<CTxMemPoolEntry>_>,_boost::mpl::vector0<mpl_::na>,_boost::multi_index::detail::hashed_unique_tag>
    ::end(this_00);
    in_stack_ffffffffffffff8f =
         boost::operators_impl::operator!=
                   ((hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>
                     *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88),
                    (hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>
                     *)in_stack_ffffffffffffff80);
    if (!(bool)in_stack_ffffffffffffff8f) break;
    std::
    vector<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
    ::push_back((vector<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                 *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88),
                (value_type *)in_stack_ffffffffffffff80);
    boost::multi_index::detail::
    hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>
    ::operator++((hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>
                  *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
  }
  iVar2 = std::
          vector<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
          ::begin(in_stack_ffffffffffffff80);
  iVar3 = std::
          vector<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
          ::end(in_stack_ffffffffffffff80);
  std::
  sort<__gnu_cxx::__normal_iterator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::index_node_base<CTxMemPoolEntry,std::allocator<CTxMemPoolEntry>>>>>>>,boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>>,boost::multi_index::detail::hashed_unique_tag,boost::multi_index::detail::hashed_index_global_iterator_tag>*,std::vector<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::mu____index::detail::hashed_index_global_iterator_tag>>>>,(anonymous_namespace)::DepthAndScoreComparator>
            (iVar2._M_current,iVar3._M_current);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (vector<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
          *)in_RDI;
}

Assistant:

std::vector<CTxMemPool::indexed_transaction_set::const_iterator> CTxMemPool::GetSortedDepthAndScore() const
{
    std::vector<indexed_transaction_set::const_iterator> iters;
    AssertLockHeld(cs);

    iters.reserve(mapTx.size());

    for (indexed_transaction_set::iterator mi = mapTx.begin(); mi != mapTx.end(); ++mi) {
        iters.push_back(mi);
    }
    std::sort(iters.begin(), iters.end(), DepthAndScoreComparator());
    return iters;
}